

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O1

char * __cxxabiv1::anon_unknown_0::parse_new_expr<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  pointer *ppsVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar5;
  byte bVar6;
  size_type sVar7;
  char *pcVar8;
  char *pcVar9;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *this;
  pointer psVar10;
  undefined4 uVar11;
  char *pcVar12;
  bool bVar13;
  String r;
  String expr_list;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  type;
  String init_list;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_180;
  undefined4 local_160;
  uint local_15c;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_138;
  undefined8 local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  local_128;
  value_type local_118;
  ulong local_d8;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_90;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_70;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_50;
  
  if ((long)last - (long)first < 4) {
    return first;
  }
  if (*first == 'g') {
    local_d8 = (ulong)(first[1] == 's');
    pcVar12 = first + local_d8 * 2;
  }
  else {
    local_d8 = 0;
    pcVar12 = first;
  }
  if (*pcVar12 != 'n') {
    return first;
  }
  bVar6 = pcVar12[1];
  if ((bVar6 != 0x77) && (bVar6 != 0x61)) {
    return first;
  }
  pcVar12 = pcVar12 + 2;
  if (pcVar12 == last) {
    return first;
  }
  local_15c = (uint)bVar6;
  bVar13 = false;
  while (*pcVar12 != '_') {
    pcVar8 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>(pcVar12,last,db);
    bVar13 = pcVar8 == pcVar12;
    if (pcVar8 != last) {
      pcVar12 = pcVar8;
    }
    if (pcVar8 == last || bVar13) {
      return first;
    }
    bVar13 = true;
  }
  pcVar12 = pcVar12 + 1;
  pcVar8 = parse_type<__cxxabiv1::(anonymous_namespace)::Db>(pcVar12,last,db);
  if (pcVar8 == last || pcVar8 == pcVar12) {
    return first;
  }
  if ((long)last - (long)pcVar8 < 3) {
    uVar11 = 0;
  }
  else if ((*pcVar8 == 'p') && (pcVar8[1] == 'i')) {
    pcVar8 = pcVar8 + 2;
    while (*pcVar8 != 'E') {
      pcVar9 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>(pcVar8,last,db);
      if (pcVar9 == pcVar8) {
        return first;
      }
      pcVar8 = pcVar9;
      if (pcVar9 == last) {
        return first;
      }
    }
    uVar11 = (undefined4)CONCAT71((int7)((ulong)pcVar12 >> 8),1);
  }
  else {
    uVar11 = 0;
  }
  if (*pcVar8 != 'E') {
    return first;
  }
  paVar4 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar4;
  if ((char)uVar11 != '\0') {
    psVar10 = (db->names).
              super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((db->names).
        super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ._M_impl.super__Vector_impl_data._M_start == psVar10) goto LAB_001abc96;
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::move_full(&local_50,psVar10 + -1);
    (anonymous_namespace)::parse_new_expr<__cxxabiv1::(anonymous_namespace)::Db>();
  }
  psVar10 = (db->names).
            super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((db->names).
      super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ._M_impl.super__Vector_impl_data._M_start == psVar10) goto LAB_001abc96;
  this = psVar10 + -1;
  local_160 = uVar11;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  ::move_full(&local_b0,this);
  ppsVar1 = &(db->names).
             super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  psVar10 = *ppsVar1 + -1;
  *ppsVar1 = psVar10;
  std::
  allocator_traits<__cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>,4096ul>>
  ::
  destroy<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>>
            ((short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>
              *)psVar10,this);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  if (bVar13) {
    psVar10 = (db->names).
              super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((db->names).
        super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ._M_impl.super__Vector_impl_data._M_start != psVar10) {
      string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
      ::move_full(&local_70,psVar10 + -1);
      (anonymous_namespace)::parse_new_expr<__cxxabiv1::(anonymous_namespace)::Db>();
      goto LAB_001ab9a3;
    }
  }
  else {
LAB_001ab9a3:
    uVar11 = local_160;
    paVar2 = &local_158.field_2;
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_158._M_dataplus._M_p = (pointer)paVar2;
    if ((char)local_d8 != '\0') {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::operator=(&local_158,"::");
    }
    pcVar12 = " ";
    if ((char)local_15c == 'a') {
      pcVar12 = "[] ";
    }
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::append(&local_158,pcVar12);
    if (bVar13) {
      std::operator+(&local_180,"(",&local_d0);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::append(&local_180,") ");
      sVar7 = local_180._M_string_length;
      paVar5 = &local_118.first.field_2;
      paVar3 = &local_180.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_180._M_dataplus._M_p == paVar3) {
        local_118.first.field_2._8_8_ = local_180.field_2._8_8_;
        local_118.first._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_118.first._M_dataplus._M_p = local_180._M_dataplus._M_p;
      }
      local_118.first._M_string_length = local_180._M_string_length;
      local_180._M_string_length = 0;
      local_180.field_2._M_local_buf[0] = '\0';
      local_180._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::_M_append(&local_158,local_118.first._M_dataplus._M_p,sVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_118.first._M_dataplus._M_p != paVar5) {
        free(local_118.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_180._M_dataplus._M_p != paVar3) {
        free(local_180._M_dataplus._M_p);
      }
    }
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::_M_append(&local_158,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    if ((char)uVar11 != '\0') {
      std::operator+(&local_180," (",&local_90);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::append(&local_180,")");
      sVar7 = local_180._M_string_length;
      paVar5 = &local_118.first.field_2;
      paVar3 = &local_180.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_180._M_dataplus._M_p == paVar3) {
        local_118.first.field_2._8_8_ = local_180.field_2._8_8_;
        local_118.first._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_118.first._M_dataplus._M_p = local_180._M_dataplus._M_p;
      }
      local_118.first.field_2._M_allocated_capacity._1_7_ =
           local_180.field_2._M_allocated_capacity._1_7_;
      local_118.first.field_2._M_local_buf[0] = local_180.field_2._M_local_buf[0];
      local_118.first._M_string_length = local_180._M_string_length;
      local_180._M_string_length = 0;
      local_180.field_2._M_local_buf[0] = '\0';
      local_180._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::_M_append(&local_158,local_118.first._M_dataplus._M_p,sVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_118.first._M_dataplus._M_p != paVar5) {
        free(local_118.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_180._M_dataplus._M_p != paVar3) {
        free(local_180._M_dataplus._M_p);
      }
    }
    local_118.first._M_string_length = local_158._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_158._M_dataplus._M_p == paVar2) {
      local_128._8_8_ = local_158.field_2._8_8_;
      local_138 = &local_128;
    }
    else {
      local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                   *)local_158._M_dataplus._M_p;
    }
    local_128._M_allocated_capacity._1_7_ = local_158.field_2._M_allocated_capacity._1_7_;
    local_128._M_local_buf[0] = local_158.field_2._M_local_buf[0];
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_118.first._M_dataplus._M_p = (pointer)&local_118.first.field_2;
    if (local_138 == &local_128) {
      local_118.first.field_2._8_8_ = local_128._8_8_;
    }
    else {
      local_118.first._M_dataplus._M_p = (pointer)local_138;
    }
    local_118.first.field_2._M_allocated_capacity = local_128._M_allocated_capacity;
    local_118.second._M_dataplus._M_p = (pointer)&local_118.second.field_2;
    local_130 = 0;
    local_128._M_allocated_capacity =
         (ulong)(uint7)local_158.field_2._M_allocated_capacity._1_7_ << 8;
    local_118.second._M_string_length = 0;
    local_118.second.field_2._M_local_buf[0] = '\0';
    local_158._M_dataplus._M_p = (pointer)paVar2;
    local_138 = &local_128;
    std::
    vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ::push_back(&db->names,&local_118);
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::~string_pair(&local_118);
    if (local_138 != &local_128) {
      free(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_158._M_dataplus._M_p != paVar2) {
      free(local_158._M_dataplus._M_p);
    }
    first = pcVar8 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    free(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    free(local_b0._M_dataplus._M_p);
  }
LAB_001abc96:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_90._M_dataplus._M_p != paVar4) {
    free(local_90._M_dataplus._M_p);
  }
  return first;
}

Assistant:

const char*
parse_new_expr(const char* first, const char* last, C& db)
{
    if (last - first >= 4)
    {
        const char* t = first;
        bool parsed_gs = false;
        if (t[0] == 'g' && t[1] == 's')
        {
            t += 2;
            parsed_gs = true;
        }
        if (t[0] == 'n' && (t[1] == 'w' || t[1] == 'a'))
        {
            bool is_array = t[1] == 'a';
            t += 2;
            if (t == last)
                return first;
            bool has_expr_list = false;
            bool first_expr = true;
            while (*t != '_')
            {
                const char* t1 = parse_expression(t, last, db);
                if (t1 == t || t1 == last)
                    return first;
                has_expr_list = true;
                if (!first_expr)
                {
                    if (db.names.empty())
                        return first;
                    auto tmp = db.names.back().move_full();
                    db.names.pop_back();
                    if (!tmp.empty())
                    {
                        if (db.names.empty())
                            return first;
                        db.names.back().first.append(", ");
                        db.names.back().first.append(tmp);
                        first_expr = false;
                    }
                }
                t = t1;
            }
            ++t;
            const char* t1 = parse_type(t, last, db);
            if (t1 == t || t1 == last)
                return first;
            t = t1;
            bool has_init = false;
            if (last - t >= 3 && t[0] == 'p' && t[1] == 'i')
            {
                t += 2;
                has_init = true;
                first_expr = true;
                while (*t != 'E')
                {
                    t1 = parse_expression(t, last, db);
                    if (t1 == t || t1 == last)
                        return first;
                    if (!first_expr)
                    {
                        if (db.names.empty())
                            return first;
                        auto tmp = db.names.back().move_full();
                        db.names.pop_back();
                        if (!tmp.empty())
                        {
                            if (db.names.empty())
                                return first;
                            db.names.back().first.append(", ");
                            db.names.back().first.append(tmp);
                            first_expr = false;
                        }
                    }
                    t = t1;
                }
            }
            if (*t != 'E')
                return first;
            typename C::String init_list;
            if (has_init)
            {
                if (db.names.empty())
                    return first;
                init_list = db.names.back().move_full();
                db.names.pop_back();
            }
            if (db.names.empty())
                return first;
            auto type = db.names.back().move_full();
            db.names.pop_back();
            typename C::String expr_list;
            if (has_expr_list)
            {
                if (db.names.empty())
                    return first;
                expr_list = db.names.back().move_full();
                db.names.pop_back();
            }
            typename C::String r;
            if (parsed_gs)
                r = "::";
            if (is_array)
                r += "[] ";
            else
                r += " ";
            if (has_expr_list)
                r += "(" + expr_list + ") ";
            r += type;
            if (has_init)
                r += " (" + init_list + ")";
            db.names.push_back(std::move(r));
            first = t+1;
        }
    }
    return first;
}